

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_tcp.cpp
# Opt level: O3

void __thiscall miniros::TransportTCP::socketUpdate(TransportTCP *this,int events)

{
  recursive_mutex *__mutex;
  int iVar1;
  socklen_t *in_RCX;
  sockaddr *__addr;
  TransportTCPPtr transport;
  uint32_t error;
  socklen_t len;
  undefined1 local_48 [32];
  undefined4 local_28;
  socklen_t local_24;
  
  __mutex = &this->close_mutex_;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (this->closed_ != false) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  if (((events & 1U) != 0) && (this->expecting_read_ == true)) {
    if (this->is_server_ == true) {
      accept((TransportTCP *)local_48,(int)this,__addr,in_RCX);
      if ((element_type *)local_48._0_8_ != (element_type *)0x0) {
        if ((this->accept_cb_).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->accept_cb_)._M_invoker)
                  ((_Any_data *)&this->accept_cb_,(shared_ptr<miniros::TransportTCP> *)local_48);
      }
    }
    else {
      if ((this->super_Transport).read_cb_.super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_002238f8;
      std::__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<miniros::Transport,void>
                ((__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2> *)local_48,
                 (__weak_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2> *)
                 &(this->super_Transport).super_enable_shared_from_this<miniros::Transport>);
      if ((this->super_Transport).read_cb_.super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->super_Transport).read_cb_._M_invoker)
                ((_Any_data *)&(this->super_Transport).read_cb_,
                 (shared_ptr<miniros::Transport> *)local_48);
    }
    if ((element_type *)local_48._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
LAB_002238f8:
  if ((((events & 4U) != 0) && (this->expecting_write_ == true)) &&
     ((this->super_Transport).write_cb_.super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<miniros::Transport,void>
              ((__shared_ptr<miniros::Transport,(__gnu_cxx::_Lock_policy)2> *)local_48,
               (__weak_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_Transport).super_enable_shared_from_this<miniros::Transport>);
    if ((this->super_Transport).write_cb_.super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->super_Transport).write_cb_._M_invoker)
              ((_Any_data *)&(this->super_Transport).write_cb_,
               (shared_ptr<miniros::Transport> *)local_48);
    if ((element_type *)local_48._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  if ((events & 0x2038U) != 0) {
    local_28 = 0xffffffff;
    local_24 = 4;
    iVar1 = getsockopt(this->sock_,1,4,&local_28,&local_24);
    if (iVar1 < 0) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (socketUpdate::loc.initialized_ == false) {
        local_48._0_8_ = (element_type *)(local_48 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"miniros.transport_tcp","");
        console::initializeLogLocation(&socketUpdate::loc,(string *)local_48,Debug);
        if ((element_type *)local_48._0_8_ != (element_type *)(local_48 + 0x10)) {
          operator_delete((void *)local_48._0_8_,(ulong)(local_48._16_8_ + 1));
        }
      }
      if (socketUpdate::loc.level_ != Debug) {
        socketUpdate();
      }
      if (socketUpdate::loc.logger_enabled_ == true) {
        socketUpdate((TransportTCP *)&this->sock_);
      }
    }
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (socketUpdate(int)::loc.initialized_ == false) {
      local_48._0_8_ = (element_type *)(local_48 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"miniros.transport_tcp","")
      ;
      console::initializeLogLocation(&socketUpdate(int)::loc,(string *)local_48,Debug);
      if ((element_type *)local_48._0_8_ != (element_type *)(local_48 + 0x10)) {
        operator_delete((void *)local_48._0_8_,(ulong)(local_48._16_8_ + 1));
      }
    }
    if (socketUpdate(int)::loc.level_ != Debug) {
      socketUpdate();
    }
    if (socketUpdate(int)::loc.logger_enabled_ == true) {
      socketUpdate();
    }
    (*(this->super_Transport)._vptr_Transport[8])(this);
  }
  return;
}

Assistant:

void TransportTCP::socketUpdate(int events)
{
  {
    std::scoped_lock<std::recursive_mutex> lock(close_mutex_);
    if (closed_)
    {
      return;
    }

    // Handle read events before err/hup/nval, since there may be data left on the wire
    if ((events & POLLIN) && expecting_read_)
    {
      if (is_server_)
      {
        // Should not block here, because poll() said that it's ready
        // for reading
        TransportTCPPtr transport = accept();
        if (transport)
        {
          MINIROS_ASSERT(accept_cb_);
          accept_cb_(transport);
        }
      }
      else
      {
        if (read_cb_)
        {
          read_cb_(shared_from_this());
        }
      }
    }

    if ((events & POLLOUT) && expecting_write_)
    {
      if (write_cb_)
      {
        write_cb_(shared_from_this());
      }
    }
  }

  if((events & POLLERR) ||
     (events & POLLHUP) ||
#if defined(POLLRDHUP) // POLLRDHUP is not part of POSIX!
     (events & POLLRDHUP) ||
#endif
     (events & POLLNVAL))
  {
    uint32_t error = -1;
    socklen_t len = sizeof(error);
    if (getsockopt(sock_, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&error), &len) < 0)
    {
      MINIROS_DEBUG("getsockopt failed on socket [%d]", sock_);
    }
  #ifdef _MSC_VER
    char err[60];
    strerror_s(err,60,error);
    MINIROS_DEBUG("Socket %d closed with (ERR|HUP|NVAL) events %d: %s", sock_, events, err);
  #else
    MINIROS_DEBUG("Socket %d closed with (ERR|HUP|NVAL) events %d: %s", sock_, events, strerror(error));
  #endif

    close();
  }
}